

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_16da50::EqualizerState::update
          (EqualizerState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  pointer paVar1;
  pointer paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  long lVar16;
  float *pfVar17;
  MixParams *mix;
  span<float,_16UL> gains;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float local_70 [16];
  
  mix = target.Main;
  fVar22 = (float)((context->mDevice).mPtr)->Frequency;
  fVar23 = 0.001;
  if (0.001 <= SQRT((props->Reverb).Diffusion)) {
    fVar23 = SQRT((props->Reverb).Diffusion);
  }
  BiquadFilterR<float>::setParams
            (this->mChans[0].filter,LowShelf,(props->Reverb).Density / fVar22,fVar23,
             SQRT((1.0 / fVar23 + fVar23) * 0.33333337 + 2.0));
  fVar23 = (props->Reverb).GainHF;
  fVar18 = (props->Reverb).Gain / fVar22;
  fVar19 = fVar18 * 6.2831855;
  fVar21 = (props->Reverb).DecayTime;
  fVar20 = sinf(fVar19);
  fVar21 = sinhf((fVar21 * 0.3465736 * fVar19) / fVar20);
  BiquadFilterR<float>::setParams
            (this->mChans[0].filter + 1,Peaking,fVar18,SQRT(fVar23),fVar21 + fVar21);
  fVar23 = (props->Reverb).ReflectionsGain;
  fVar20 = (props->Reverb).DecayHFRatio / fVar22;
  fVar18 = fVar20 * 6.2831855;
  fVar21 = (props->Reverb).ReflectionsDelay;
  fVar19 = sinf(fVar18);
  fVar21 = sinhf((fVar21 * 0.3465736 * fVar18) / fVar19);
  BiquadFilterR<float>::setParams
            (this->mChans[0].filter + 2,Peaking,fVar20,SQRT(fVar23),fVar21 + fVar21);
  fVar23 = 0.001;
  if (0.001 <= SQRT((props->Reverb).LateReverbDelay)) {
    fVar23 = SQRT((props->Reverb).LateReverbDelay);
  }
  BiquadFilterR<float>::setParams
            (this->mChans[0].filter + 3,HighShelf,(props->Reverb).LateReverbGain / fVar22,fVar23,
             SQRT((1.0 / fVar23 + fVar23) * 0.33333337 + 2.0));
  uVar15 = (long)(slot->Wet).Buffer.mDataEnd - (long)(slot->Wet).Buffer.mData >> 0xc;
  if (1 < uVar15) {
    fVar19 = this->mChans[0].filter[0].mB0;
    fVar20 = this->mChans[0].filter[0].mB1;
    fVar5 = this->mChans[0].filter[0].mB2;
    fVar6 = this->mChans[0].filter[0].mA1;
    fVar23 = this->mChans[0].filter[0].mA2;
    fVar7 = this->mChans[0].filter[1].mB0;
    fVar8 = this->mChans[0].filter[1].mB1;
    fVar9 = this->mChans[0].filter[1].mB2;
    fVar10 = this->mChans[0].filter[1].mA1;
    fVar22 = this->mChans[0].filter[1].mA2;
    fVar11 = this->mChans[0].filter[2].mB0;
    fVar12 = this->mChans[0].filter[2].mB1;
    fVar13 = this->mChans[0].filter[2].mB2;
    fVar14 = this->mChans[0].filter[2].mA1;
    fVar21 = this->mChans[0].filter[2].mA2;
    uVar3 = *(undefined8 *)&this->mChans[0].filter[3].mB0;
    uVar4 = *(undefined8 *)&this->mChans[0].filter[3].mB2;
    fVar18 = this->mChans[0].filter[3].mA2;
    lVar16 = uVar15 - 1;
    pfVar17 = &this->mChans[1].filter[3].mA2;
    do {
      pfVar17[-0x19] = fVar19;
      pfVar17[-0x18] = fVar20;
      pfVar17[-0x17] = fVar5;
      pfVar17[-0x16] = fVar6;
      pfVar17[-0x15] = fVar23;
      pfVar17[-0x12] = fVar7;
      pfVar17[-0x11] = fVar8;
      pfVar17[-0x10] = fVar9;
      pfVar17[-0xf] = fVar10;
      pfVar17[-0xe] = fVar22;
      pfVar17[-0xb] = fVar11;
      pfVar17[-10] = fVar12;
      pfVar17[-9] = fVar13;
      pfVar17[-8] = fVar14;
      pfVar17[-7] = fVar21;
      *(undefined8 *)(pfVar17 + -4) = uVar3;
      *(undefined8 *)(pfVar17 + -2) = uVar4;
      *pfVar17 = fVar18;
      pfVar17 = pfVar17 + 0x3c;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  paVar1 = (mix->Buffer).mDataEnd;
  (this->super_EffectState).mOutTarget.mData = (mix->Buffer).mData;
  (this->super_EffectState).mOutTarget.mDataEnd = paVar1;
  paVar1 = (slot->Wet).Buffer.mDataEnd;
  paVar2 = (slot->Wet).Buffer.mData;
  if (paVar1 != paVar2) {
    local_70[0xd] = 0.0;
    local_70[0xe] = 0.0;
    local_70[0xf] = 0.0;
    local_70[9] = 0.0;
    local_70[10] = 0.0;
    local_70[0xb] = 0.0;
    local_70[0xc] = 0.0;
    local_70[5] = 0.0;
    local_70[6] = 0.0;
    local_70[7] = 0.0;
    local_70[8] = 0.0;
    local_70[1] = 0.0;
    local_70[2] = 0.0;
    local_70[3] = 0.0;
    local_70[4] = 0.0;
    local_70[0] = 1.0;
    ComputePanGains(mix,local_70,slot->Gain,(span<float,_16UL>)this->mChans[0].TargetGains);
    if ((long)paVar1 - (long)paVar2 != 0x1000) {
      gains.mData = this->mChans[1].TargetGains;
      lVar16 = 0;
      do {
        (local_70 + lVar16)[0] = 0.0;
        (local_70 + lVar16)[1] = 1.0;
        ComputePanGains(mix,local_70,slot->Gain,gains);
        lVar16 = lVar16 + 1;
        gains.mData = gains.mData + 0x3c;
      } while (((long)paVar1 - (long)paVar2 >> 0xc) + -1 != lVar16);
    }
  }
  return;
}

Assistant:

void EqualizerState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};
    auto frequency = static_cast<float>(device->Frequency);
    float gain, f0norm;

    /* Calculate coefficients for the each type of filter. Note that the shelf
     * and peaking filters' gain is for the centerpoint of the transition band,
     * while the effect property gains are for the shelf/peak itself. So the
     * property gains need their dB halved (sqrt of linear gain) for the
     * shelf/peak to reach the provided gain.
     */
    gain = std::sqrt(props->Equalizer.LowGain);
    f0norm = props->Equalizer.LowCutoff / frequency;
    mChans[0].filter[0].setParamsFromSlope(BiquadType::LowShelf, f0norm, gain, 0.75f);

    gain = std::sqrt(props->Equalizer.Mid1Gain);
    f0norm = props->Equalizer.Mid1Center / frequency;
    mChans[0].filter[1].setParamsFromBandwidth(BiquadType::Peaking, f0norm, gain,
        props->Equalizer.Mid1Width);

    gain = std::sqrt(props->Equalizer.Mid2Gain);
    f0norm = props->Equalizer.Mid2Center / frequency;
    mChans[0].filter[2].setParamsFromBandwidth(BiquadType::Peaking, f0norm, gain,
        props->Equalizer.Mid2Width);

    gain = std::sqrt(props->Equalizer.HighGain);
    f0norm = props->Equalizer.HighCutoff / frequency;
    mChans[0].filter[3].setParamsFromSlope(BiquadType::HighShelf, f0norm, gain, 0.75f);

    /* Copy the filter coefficients for the other input channels. */
    for(size_t i{1u};i < slot->Wet.Buffer.size();++i)
    {
        mChans[i].filter[0].copyParamsFrom(mChans[0].filter[0]);
        mChans[i].filter[1].copyParamsFrom(mChans[0].filter[1]);
        mChans[i].filter[2].copyParamsFrom(mChans[0].filter[2]);
        mChans[i].filter[3].copyParamsFrom(mChans[0].filter[3]);
    }

    mOutTarget = target.Main->Buffer;
    auto set_gains = [slot,target](auto &chan, al::span<const float,MAX_AMBI_CHANNELS> coeffs)
    { ComputePanGains(target.Main, coeffs.data(), slot->Gain, chan.TargetGains); };
    SetAmbiPanIdentity(std::begin(mChans), slot->Wet.Buffer.size(), set_gains);
}